

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

Odc_Lit_t Odc_And(Odc_Man_t *p,Odc_Lit_t iFan0,Odc_Lit_t iFan1)

{
  ushort uVar1;
  Vec_Int_t *pVVar2;
  Odc_Obj_t *pOVar3;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  Odc_Lit_t OVar9;
  int iVar10;
  Odc_Lit_t *pOVar11;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  if (iFan0 == iFan1) {
    return iFan0;
  }
  if ((iFan1 ^ iFan0) == 1) {
    return 1;
  }
  if (iFan0 < 2) {
    if (iFan0 != 0) {
      return 1;
    }
    return iFan1;
  }
  if (iFan1 < 2) {
    if (iFan1 != 0) {
      return 1;
    }
    return iFan0;
  }
  uVar16 = (uint)iFan1;
  if (iFan1 < iFan0) {
    uVar16 = (uint)iFan0;
  }
  uVar15 = (uint)iFan1;
  if (iFan0 < iFan1) {
    uVar15 = (uint)iFan0;
  }
  uVar5 = (ushort)uVar15;
  uVar12 = (ushort)uVar16;
  if (uVar12 <= uVar5) {
    __assert_fail("iFan0 < iFan1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcOdc.c"
                  ,0x21a,"Odc_Lit_t *Odc_HashLookup(Odc_Man_t *, Odc_Lit_t, Odc_Lit_t)");
  }
  uVar14 = 0x38f;
  if ((uVar15 & 1) == 0) {
    uVar14 = 0;
  }
  uVar6 = 0x161;
  if ((uVar16 & 1) == 0) {
    uVar6 = 0;
  }
  uVar13 = (ulong)(uVar6 ^ uVar14 ^ (uVar15 & 0xfffe) * 0x1f01 ^ (uVar16 & 0xfffe) * 0xb9b) %
           (ulong)(uint)p->nTableSize;
  uVar7 = (ulong)p->pTable[uVar13];
  if (p->pTable[uVar13] == 0) {
    pVVar2 = p->vUsedSpots;
    uVar14 = pVVar2->nSize;
    if (uVar14 == pVVar2->nCap) {
      if ((int)uVar14 < 0x10) {
        if (pVVar2->pArray == (int *)0x0) {
          piVar8 = (int *)malloc(0x40);
        }
        else {
          piVar8 = (int *)realloc(pVVar2->pArray,0x40);
        }
        pVVar2->pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_00279b25:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar2->nCap = 0x10;
      }
      else {
        if (pVVar2->pArray == (int *)0x0) {
          piVar8 = (int *)malloc((ulong)uVar14 * 8);
        }
        else {
          piVar8 = (int *)realloc(pVVar2->pArray,(ulong)uVar14 * 8);
        }
        pVVar2->pArray = piVar8;
        if (piVar8 == (int *)0x0) goto LAB_00279b25;
        pVVar2->nCap = uVar14 * 2;
      }
    }
    else {
      piVar8 = pVVar2->pArray;
    }
    iVar10 = pVVar2->nSize;
    pVVar2->nSize = iVar10 + 1;
    piVar8[iVar10] = (int)uVar13;
    uVar1 = p->pTable[uVar13];
    uVar7 = (ulong)uVar1;
    if (uVar1 == 0) {
      pOVar11 = p->pTable + uVar13;
      iVar10 = p->nObjs;
      goto LAB_00279a53;
    }
  }
  do {
    if ((uVar7 & 1) != 0) goto LAB_00279ac8;
    iVar4 = (int)(uVar7 >> 1);
    iVar10 = p->nObjs;
    if (iVar10 <= iVar4) goto LAB_00279ac8;
    pOVar3 = p->pObjs;
    uVar13 = (ulong)(uint)(iVar4 << 4);
    if ((*(ushort *)((long)&pOVar3->iFan0 + uVar13) == uVar5) &&
       (*(ushort *)((long)&pOVar3->iFan1 + uVar13) == uVar12)) {
      return (Odc_Lit_t)uVar7;
    }
    uVar1 = *(ushort *)((long)&pOVar3->iNext + uVar13);
    uVar7 = (ulong)uVar1;
  } while (uVar1 != 0);
  pOVar11 = (Odc_Lit_t *)((long)&pOVar3->iNext + uVar13);
LAB_00279a53:
  if (p->nObjsAlloc <= iVar10) {
    __assert_fail("p->nObjs < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcOdc.c"
                  ,0x77,"Odc_Obj_t *Odc_ObjNew(Odc_Man_t *)");
  }
  pOVar3 = p->pObjs;
  p->nObjs = iVar10 + 1U;
  pOVar3[iVar10].iFan0 = uVar5;
  pOVar3[iVar10].iFan1 = uVar12;
  pOVar3[iVar10].iNext = 0;
  pOVar3[iVar10].TravId = 0;
  uVar15 = (uVar15 & 0xfffe) >> 1;
  if (((int)uVar15 <= iVar10) && (uVar16 = (uVar16 & 0xfffe) >> 1, uVar16 < iVar10 + 1U)) {
    pOVar3[iVar10].uMask =
         *(uint *)((long)&pOVar3->uMask + (ulong)(uVar16 << 4)) |
         *(uint *)((long)&pOVar3->uMask + (ulong)(uVar15 << 4));
    OVar9 = (short)iVar10 * 2;
    *pOVar11 = OVar9;
    return OVar9;
  }
LAB_00279ac8:
  __assert_fail("!(Lit & 1) && (int)(Lit>>1) < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcOdc.c"
                ,0x79,"Odc_Obj_t *Odc_Lit2Obj(Odc_Man_t *, Odc_Lit_t)");
}

Assistant:

static inline Odc_Lit_t Odc_And( Odc_Man_t * p, Odc_Lit_t iFan0, Odc_Lit_t iFan1 )
{
    Odc_Obj_t * pObj;
    Odc_Lit_t * pEntry;
    unsigned uMask0, uMask1;
    int Temp;
    // consider trivial cases
    if ( iFan0 == iFan1 )
        return iFan0;
    if ( iFan0 == Odc_Not(iFan1) )
        return Odc_Const0();
    if ( Odc_Regular(iFan0) == Odc_Const1() )
        return iFan0 == Odc_Const1() ? iFan1 : Odc_Const0();
    if ( Odc_Regular(iFan1) == Odc_Const1() )
        return iFan1 == Odc_Const1() ? iFan0 : Odc_Const0();
    // canonicize the fanin order
    if ( iFan0 > iFan1 )
        Temp = iFan0, iFan0 = iFan1, iFan1 = Temp;
    // check if a node with these fanins exists
    pEntry = Odc_HashLookup( p, iFan0, iFan1 );
    if ( *pEntry )
        return *pEntry;
    // create a new node
    pObj = Odc_ObjNew( p );
    pObj->iFan0 = iFan0;
    pObj->iFan1 = iFan1;
    pObj->iNext = 0;
    pObj->TravId = 0;
    // set the mask
    uMask0 = Odc_Lit2Obj(p, Odc_Regular(iFan0))->uMask;
    uMask1 = Odc_Lit2Obj(p, Odc_Regular(iFan1))->uMask;
    pObj->uMask = uMask0 | uMask1;
    // add to the table
    *pEntry = Odc_Obj2Lit( p, pObj );
    return *pEntry;
}